

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O0

Expression * wasm::TypeUpdating::fixLocalGet(LocalGet *get,Module *wasm)

{
  bool bVar1;
  Type TVar2;
  size_t sVar3;
  TupleExtract *pTVar4;
  reference ppEVar5;
  Type *this;
  RefAs *pRVar6;
  LocalGet *local_d0;
  LocalGet *elemGet;
  Index size;
  Index i;
  Builder builder;
  allocator<wasm::Expression_*> local_79;
  undefined1 local_78 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> elems;
  Type local_48;
  Type type;
  Module *wasm_local;
  LocalGet *get_local;
  
  bVar1 = wasm::Type::isNonNullable
                    (&(get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type
                    );
  if (bVar1) {
    TVar2 = getValidLocalType((get->super_SpecificExpression<(wasm::Expression::Id)8>).
                              super_Expression.type.id,(FeatureSet)(wasm->features).features);
    (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = TVar2.id;
    Builder::Builder((Builder *)&type,wasm);
    get_local = (LocalGet *)Builder::makeRefAs((Builder *)&type,RefAsNonNull,(Expression *)get);
  }
  else {
    bVar1 = wasm::Type::isTuple(&(get->super_SpecificExpression<(wasm::Expression::Id)8>).
                                 super_Expression.type);
    get_local = get;
    if (bVar1) {
      local_48.id = (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.
                    id;
      elems.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (wasm->features).features;
      TVar2 = getValidLocalType(local_48,elems.
                                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = TVar2.id;
      sVar3 = wasm::Type::size(&local_48);
      std::allocator<wasm::Expression_*>::allocator(&local_79);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_78,sVar3,
                 &local_79);
      std::allocator<wasm::Expression_*>::~allocator(&local_79);
      Builder::Builder((Builder *)&size,wasm);
      elemGet._4_4_ = 0;
      sVar3 = wasm::Type::size(&local_48);
      for (; elemGet._4_4_ < (uint)sVar3; elemGet._4_4_ = elemGet._4_4_ + 1) {
        local_d0 = get;
        if (elemGet._4_4_ != 0) {
          local_d0 = Builder::makeLocalGet
                               ((Builder *)&size,get->index,
                                (Type)(get->super_SpecificExpression<(wasm::Expression::Id)8>).
                                      super_Expression.type.id);
        }
        pTVar4 = Builder::makeTupleExtract((Builder *)&size,(Expression *)local_d0,elemGet._4_4_);
        ppEVar5 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             local_78,(ulong)elemGet._4_4_);
        *ppEVar5 = (value_type)pTVar4;
        this = wasm::Type::operator[](&local_48,(ulong)elemGet._4_4_);
        bVar1 = wasm::Type::isNonNullable(this);
        if (bVar1) {
          ppEVar5 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               local_78,(ulong)elemGet._4_4_);
          pRVar6 = Builder::makeRefAs((Builder *)&size,RefAsNonNull,*ppEVar5);
          ppEVar5 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               local_78,(ulong)elemGet._4_4_);
          *ppEVar5 = (value_type)pRVar6;
        }
      }
      get_local = (LocalGet *)
                  Builder::
                  makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                            ((Builder *)&size,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             local_78);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_78);
    }
  }
  return (Expression *)get_local;
}

Assistant:

Expression* fixLocalGet(LocalGet* get, Module& wasm) {
  if (get->type.isNonNullable()) {
    // The get should now return a nullable value, and a ref.as_non_null
    // fixes that up.
    get->type = getValidLocalType(get->type, wasm.features);
    return Builder(wasm).makeRefAs(RefAsNonNull, get);
  }
  if (get->type.isTuple()) {
    auto type = get->type;
    get->type = getValidLocalType(type, wasm.features);
    std::vector<Expression*> elems(type.size());
    Builder builder(wasm);
    for (Index i = 0, size = type.size(); i < size; ++i) {
      auto* elemGet =
        i == 0 ? get : builder.makeLocalGet(get->index, get->type);
      elems[i] = builder.makeTupleExtract(elemGet, i);
      if (type[i].isNonNullable()) {
        elems[i] = builder.makeRefAs(RefAsNonNull, elems[i]);
      }
    }
    return builder.makeTupleMake(std::move(elems));
  }
  return get;
}